

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O2

ostream * eglu::operator<<(ostream *str,SurfaceAttribListFmt *fmt)

{
  uint value;
  SurfaceAttribValueFmt in_RAX;
  char *pcVar1;
  ostream *poVar2;
  int iVar3;
  Hex<8UL> hex;
  SurfaceAttribValueFmt local_38;
  
  local_38 = in_RAX;
  std::operator<<(str,"{ ");
  iVar3 = 0;
  while( true ) {
    value = fmt->attribs[iVar3];
    hex.value._4_4_ = 0;
    hex.value._0_4_ = value;
    if (iVar3 != 0) {
      std::operator<<(str,", ");
    }
    if (value == 0x3038) break;
    pcVar1 = getSurfaceAttribName(value);
    if (pcVar1 == (char *)0x0) {
      poVar2 = tcu::Format::operator<<(str,hex);
      pcVar1 = ", ???";
LAB_00e22d25:
      std::operator<<(poVar2,pcVar1);
      std::operator<<(str," }");
      return str;
    }
    poVar2 = std::operator<<(str,pcVar1);
    poVar2 = std::operator<<(poVar2,", ");
    local_38.value = fmt->attribs[iVar3 + 1];
    local_38.attribute = value;
    operator<<(poVar2,&local_38);
    iVar3 = iVar3 + 2;
  }
  pcVar1 = "EGL_NONE";
  poVar2 = str;
  goto LAB_00e22d25;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const SurfaceAttribListFmt& fmt)
{
	int pos = 0;

	str << "{ ";

	for (;;)
	{
		int attrib = fmt.attribs[pos];

		if (pos != 0)
			str << ", ";

		if (attrib == EGL_NONE)
		{
			// Terminate.
			str << "EGL_NONE";
			break;
		}

		const char*	attribName = getSurfaceAttribName(attrib);

		if (attribName)
		{
			// Valid attribute, print value.
			str << attribName << ", " << getSurfaceAttribValueStr(attrib, fmt.attribs[pos+1]);
			pos += 2;
		}
		else
		{
			// Invalid attribute. Terminate parsing.
			str << tcu::toHex(attrib) << ", ???";
			break;
		}
	}

	str << " }";
	return str;
}